

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O3

SXML_CHAR * XMLNode_get_XPath(XMLNode *node,SXML_CHAR **xpath,int incl_parents)

{
  SXML_CHAR *pSVar1;
  SXML_CHAR *pSVar2;
  char *pcVar3;
  SXML_CHAR *pSVar4;
  SXML_CHAR *xparent;
  SXML_CHAR *local_38;
  SXML_CHAR *local_30;
  
  local_38 = (SXML_CHAR *)0x0;
  if (node != (XMLNode *)0x0) {
    if (xpath == (SXML_CHAR **)0x0) {
      return (SXML_CHAR *)0x0;
    }
    if (node->init_value != 0x19770522) {
      return (SXML_CHAR *)0x0;
    }
    if (incl_parents == 0) {
      pSVar4 = _get_XPath(node,&local_38);
      if (pSVar4 != (SXML_CHAR *)0x0) {
        *xpath = local_38;
        return local_38;
      }
    }
    else {
      pSVar4 = (SXML_CHAR *)0x0;
      do {
        local_30 = (SXML_CHAR *)0x0;
        pSVar2 = _get_XPath(node,&local_30);
        pSVar1 = pSVar4;
        if (pSVar2 == (SXML_CHAR *)0x0) goto LAB_001072d3;
        if (pSVar4 != (SXML_CHAR *)0x0) {
          pSVar2 = strcat_alloc(&local_30,"/");
          if (pSVar2 == (SXML_CHAR *)0x0) goto LAB_001072de;
          pSVar2 = strcat_alloc(&local_30,pSVar4);
          if (pSVar2 == (SXML_CHAR *)0x0) goto LAB_001072d3;
        }
        pSVar4 = local_30;
        node = node->father;
      } while (node != (_XMLNode *)0x0);
      local_38 = local_30;
      pcVar3 = strdup("/");
      *xpath = pcVar3;
      pSVar1 = local_38;
      if ((pcVar3 != (char *)0x0) &&
         (pSVar2 = strcat_alloc(xpath,pSVar4), pSVar1 = local_38, pSVar2 != (SXML_CHAR *)0x0)) {
        return *xpath;
      }
LAB_001072d3:
      local_38 = pSVar1;
      pSVar1 = local_38;
      if (pSVar4 != (SXML_CHAR *)0x0) {
LAB_001072de:
        local_38 = pSVar1;
        free(pSVar4);
      }
    }
    *xpath = (SXML_CHAR *)0x0;
  }
  return (SXML_CHAR *)0x0;
}

Assistant:

SXML_CHAR* XMLNode_get_XPath(XMLNode* node, SXML_CHAR** xpath, int incl_parents)
{
	SXML_CHAR* xp = NULL;
	SXML_CHAR* xparent;
	XMLNode* parent;

	if (node == NULL || node->init_value != XML_INIT_DONE || xpath == NULL)
		return NULL;

	if (!incl_parents) {
		if (_get_XPath(node, &xp) == NULL) {
			*xpath = NULL;
			return NULL;
		}
		return *xpath = xp;
	}

	/* Go up to root node */
	parent = node;
	do {
		xparent = NULL;
		if (_get_XPath(parent, &xparent) == NULL) goto xp_err;
		if (xp != NULL) {
			if (strcat_alloc(&xparent, C2SX("/")) == NULL) goto xp_err;
			if (strcat_alloc(&xparent, xp) == NULL) goto xp_err;
		}
		xp = xparent;
		parent = parent->father;
	} while (parent != NULL);
	if ((*xpath = sx_strdup(C2SX("/"))) == NULL || strcat_alloc(xpath, xp) == NULL) goto xp_err;

	return *xpath;

xp_err:
	if (xp != NULL) __free(xp);
	*xpath = NULL;

	return NULL;
}